

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.h
# Opt level: O1

_Bool olsrv2_originator_is_local(netaddr *addr)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  avl_node *paVar5;
  _Bool _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar7[0] = -(addr->_addr[0] == _originator_v4._addr[0]);
  auVar7[1] = -(addr->_addr[1] == _originator_v4._addr[1]);
  auVar7[2] = -(addr->_addr[2] == _originator_v4._addr[2]);
  auVar7[3] = -(addr->_addr[3] == _originator_v4._addr[3]);
  auVar7[4] = -(addr->_addr[4] == _originator_v4._addr[4]);
  auVar7[5] = -(addr->_addr[5] == _originator_v4._addr[5]);
  auVar7[6] = -(addr->_addr[6] == _originator_v4._addr[6]);
  auVar7[7] = -(addr->_addr[7] == _originator_v4._addr[7]);
  auVar7[8] = -(addr->_addr[8] == _originator_v4._addr[8]);
  auVar7[9] = -(addr->_addr[9] == _originator_v4._addr[9]);
  auVar7[10] = -(addr->_addr[10] == _originator_v4._addr[10]);
  auVar7[0xb] = -(addr->_addr[0xb] == _originator_v4._addr[0xb]);
  auVar7[0xc] = -(addr->_addr[0xc] == _originator_v4._addr[0xc]);
  auVar7[0xd] = -(addr->_addr[0xd] == _originator_v4._addr[0xd]);
  auVar7[0xe] = -(addr->_addr[0xe] == _originator_v4._addr[0xe]);
  auVar7[0xf] = -(addr->_addr[0xf] == _originator_v4._addr[0xf]);
  uVar1 = addr->_type;
  uVar3 = addr->_prefix_len;
  auVar9[0] = -(uVar1 == _originator_v4._type);
  auVar9[1] = -(uVar3 == _originator_v4._prefix_len);
  auVar9[2] = 0xff;
  auVar9[3] = 0xff;
  auVar9[4] = 0xff;
  auVar9[5] = 0xff;
  auVar9[6] = 0xff;
  auVar9[7] = 0xff;
  auVar9[8] = 0xff;
  auVar9[9] = 0xff;
  auVar9[10] = 0xff;
  auVar9[0xb] = 0xff;
  auVar9[0xc] = 0xff;
  auVar9[0xd] = 0xff;
  auVar9[0xe] = 0xff;
  auVar9[0xf] = 0xff;
  auVar9 = auVar9 & auVar7;
  _Var6 = true;
  if (((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) &&
     (auVar8[0] = -(addr->_addr[0] == _originator_v6._addr[0]),
     auVar8[1] = -(addr->_addr[1] == _originator_v6._addr[1]),
     auVar8[2] = -(addr->_addr[2] == _originator_v6._addr[2]),
     auVar8[3] = -(addr->_addr[3] == _originator_v6._addr[3]),
     auVar8[4] = -(addr->_addr[4] == _originator_v6._addr[4]),
     auVar8[5] = -(addr->_addr[5] == _originator_v6._addr[5]),
     auVar8[6] = -(addr->_addr[6] == _originator_v6._addr[6]),
     auVar8[7] = -(addr->_addr[7] == _originator_v6._addr[7]),
     auVar8[8] = -(addr->_addr[8] == _originator_v6._addr[8]),
     auVar8[9] = -(addr->_addr[9] == _originator_v6._addr[9]),
     auVar8[10] = -(addr->_addr[10] == _originator_v6._addr[10]),
     auVar8[0xb] = -(addr->_addr[0xb] == _originator_v6._addr[0xb]),
     auVar8[0xc] = -(addr->_addr[0xc] == _originator_v6._addr[0xc]),
     auVar8[0xd] = -(addr->_addr[0xd] == _originator_v6._addr[0xd]),
     auVar8[0xe] = -(addr->_addr[0xe] == _originator_v6._addr[0xe]),
     auVar8[0xf] = -(addr->_addr[0xf] == _originator_v6._addr[0xf]), uVar2 = addr->_type,
     uVar4 = addr->_prefix_len, auVar10[0] = -(uVar2 == _originator_v6._type),
     auVar10[1] = -(uVar4 == _originator_v6._prefix_len), auVar10[2] = 0xff, auVar10[3] = 0xff,
     auVar10[4] = 0xff, auVar10[5] = 0xff, auVar10[6] = 0xff, auVar10[7] = 0xff, auVar10[8] = 0xff,
     auVar10[9] = 0xff, auVar10[10] = 0xff, auVar10[0xb] = 0xff, auVar10[0xc] = 0xff,
     auVar10[0xd] = 0xff, auVar10[0xe] = 0xff, auVar10[0xf] = 0xff, auVar10 = auVar10 & auVar8,
     (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff)) {
    paVar5 = avl_find(&_originator_set_tree,addr);
    _Var6 = paVar5 != (avl_node *)0x0;
  }
  return _Var6;
}

Assistant:

static INLINE int
netaddr_cmp(const struct netaddr *a1, const struct netaddr *a2) {
  return memcmp(a1, a2, sizeof(*a1));
}